

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ImplicitWeakMessage::~ImplicitWeakMessage(ImplicitWeakMessage *this)

{
  ~ImplicitWeakMessage(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

class PROTOBUF_EXPORT ImplicitWeakMessage : public MessageLite {
 public:
  ImplicitWeakMessage() {}
  explicit ImplicitWeakMessage(Arena* arena) : MessageLite(arena) {}

  static const ImplicitWeakMessage* default_instance();

  std::string GetTypeName() const override { return ""; }

  MessageLite* New() const override { return new ImplicitWeakMessage; }
  MessageLite* New(Arena* arena) const override {
    return Arena::CreateMessage<ImplicitWeakMessage>(arena);
  }

  void Clear() override { data_.clear(); }

  bool IsInitialized() const override { return true; }

  void CheckTypeAndMergeFrom(const MessageLite& other) override {
    data_.append(static_cast<const ImplicitWeakMessage&>(other).data_);
  }

  const char* _InternalParse(const char* ptr, ParseContext* ctx) final;

  size_t ByteSizeLong() const override { return data_.size(); }

  uint8* _InternalSerialize(uint8* target,
                            io::EpsCopyOutputStream* stream) const final {
    return stream->WriteRaw(data_.data(), static_cast<int>(data_.size()),
                            target);
  }

  int GetCachedSize() const override { return static_cast<int>(data_.size()); }

  typedef void InternalArenaConstructable_;

 private:
  std::string data_;
  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS(ImplicitWeakMessage);
}